

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::GenerateFrameworkMethods
          (MessageGenerator *this,Printer *printer)

{
  ushort *puVar1;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char>,_std::__cxx11::basic_string<char>_>_>
  this_00;
  FieldDescriptor *pFVar2;
  FieldGeneratorBase *pFVar3;
  OneofDescriptor *pOVar4;
  int i;
  int iVar5;
  csharp *pcVar6;
  Descriptor *pDVar7;
  undefined1 uVar8;
  string *in_R8;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  string_view text_08;
  string_view text_09;
  string_view input;
  string_view input_00;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  string local_50;
  
  vars.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  vars.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  vars.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  class_name_abi_cxx11_(&local_50,this);
  this_00 = absl::lts_20250127::container_internal::
            raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
            ::
            operator[]<char[11],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                      ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                        *)&vars,(key_arg<char[11]> *)0xfe747e);
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  text_08._M_str =
       "public override bool Equals(object other) {\n  return Equals(other as $class_name$);\n}\n\n"
  ;
  text_08._M_len = 0x57;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&vars,text_08);
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  text_09._M_str =
       "public bool Equals($class_name$ other) {\n  if (ReferenceEquals(other, null)) {\n    return false;\n  }\n  if (ReferenceEquals(other, this)) {\n    return true;\n  }\n"
  ;
  text_09._M_len = 0xa0;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&vars,text_09);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  for (iVar5 = 0; pDVar7 = this->descriptor_, iVar5 < pDVar7->field_count_; iVar5 = iVar5 + 1) {
    pFVar2 = Descriptor::field(pDVar7,iVar5);
    pFVar3 = CreateFieldGeneratorInternal(this,pFVar2);
    (*(pFVar3->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[0xe])(pFVar3,printer);
    (*(pFVar3->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar3);
  }
  for (iVar5 = 0; uVar8 = SUB81(in_R8,0), iVar5 < pDVar7->real_oneof_decl_count_; iVar5 = iVar5 + 1)
  {
    pOVar4 = Descriptor::oneof_decl(pDVar7,iVar5);
    puVar1 = (ushort *)(pOVar4->all_names_).payload_;
    pcVar6 = (csharp *)(ulong)*puVar1;
    input._M_len = (long)puVar1 + ~(ulong)pcVar6;
    input._M_str = (char *)0x1;
    UnderscoresToCamelCase_abi_cxx11_(&local_50,pcVar6,input,(bool)uVar8);
    text._M_str = "if ($property_name$Case != other.$property_name$Case) return false;\n";
    text._M_len = 0x44;
    in_R8 = &local_50;
    io::Printer::Print<char[14],std::__cxx11::string>
              (printer,text,(char (*) [14])0x101bc32,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    pDVar7 = this->descriptor_;
  }
  if (this->has_extension_ranges_ != false) {
    text_00._M_str = "if (!Equals(_extensions, other._extensions)) {\n  return false;\n}\n";
    text_00._M_len = 0x41;
    io::Printer::Print<>(printer,text_00);
  }
  io::Printer::Outdent(printer);
  text_01._M_str = "  return Equals(_unknownFields, other._unknownFields);\n}\n\n";
  text_01._M_len = 0x3a;
  io::Printer::Print<>(printer,text_01);
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  text_02._M_str = "public override int GetHashCode() {\n  int hash = 1;\n";
  text_02._M_len = 0x34;
  io::Printer::Print<>(printer,text_02);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  for (iVar5 = 0; pDVar7 = this->descriptor_, iVar5 < pDVar7->field_count_; iVar5 = iVar5 + 1) {
    pFVar2 = Descriptor::field(pDVar7,iVar5);
    pFVar3 = CreateFieldGeneratorInternal(this,pFVar2);
    (*(pFVar3->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[0xd])(pFVar3,printer);
    (*(pFVar3->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar3);
  }
  for (iVar5 = 0; uVar8 = SUB81(in_R8,0), iVar5 < pDVar7->real_oneof_decl_count_; iVar5 = iVar5 + 1)
  {
    pOVar4 = Descriptor::oneof_decl(pDVar7,iVar5);
    puVar1 = (ushort *)(pOVar4->all_names_).payload_;
    pcVar6 = (csharp *)(ulong)*puVar1;
    input_00._M_len = (long)puVar1 + ~(ulong)pcVar6;
    input_00._M_str = (char *)0x0;
    UnderscoresToCamelCase_abi_cxx11_(&local_50,pcVar6,input_00,(bool)uVar8);
    text_03._M_str = "hash ^= (int) $name$Case_;\n";
    text_03._M_len = 0x1b;
    in_R8 = &local_50;
    io::Printer::Print<char[5],std::__cxx11::string>
              (printer,text_03,(char (*) [5])0xd8d1e3,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    pDVar7 = this->descriptor_;
  }
  if (this->has_extension_ranges_ != false) {
    text_04._M_str = "if (_extensions != null) {\n  hash ^= _extensions.GetHashCode();\n}\n";
    text_04._M_len = 0x42;
    io::Printer::Print<>(printer,text_04);
  }
  text_05._M_str =
       "if (_unknownFields != null) {\n  hash ^= _unknownFields.GetHashCode();\n}\nreturn hash;\n";
  text_05._M_len = 0x55;
  io::Printer::Print<>(printer,text_05);
  io::Printer::Outdent(printer);
  text_06._M_str = "}\n\n";
  text_06._M_len = 3;
  io::Printer::Print<>(printer,text_06);
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  text_07._M_str =
       "public override string ToString() {\n  return pb::JsonFormatter.ToDiagnosticString(this);\n}\n\n"
  ;
  text_07._M_len = 0x5c;
  io::Printer::Print<>(printer,text_07);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&vars);
  return;
}

Assistant:

void MessageGenerator::GenerateFrameworkMethods(io::Printer* printer) {
  absl::flat_hash_map<absl::string_view, std::string> vars;
  vars["class_name"] = class_name();

  // Equality
  WriteGeneratedCodeAttributes(printer);
  printer->Print(vars,
                 "public override bool Equals(object other) {\n"
                 "  return Equals(other as $class_name$);\n"
                 "}\n\n");
  WriteGeneratedCodeAttributes(printer);
  printer->Print(vars,
                 "public bool Equals($class_name$ other) {\n"
                 "  if (ReferenceEquals(other, null)) {\n"
                 "    return false;\n"
                 "  }\n"
                 "  if (ReferenceEquals(other, this)) {\n"
                 "    return true;\n"
                 "  }\n");
  printer->Indent();
  for (int i = 0; i < descriptor_->field_count(); i++) {
    std::unique_ptr<FieldGeneratorBase> generator(
        CreateFieldGeneratorInternal(descriptor_->field(i)));
    generator->WriteEquals(printer);
  }
  for (int i = 0; i < descriptor_->real_oneof_decl_count(); i++) {
    printer->Print(
        "if ($property_name$Case != other.$property_name$Case) return false;\n",
        "property_name",
        UnderscoresToCamelCase(descriptor_->oneof_decl(i)->name(), true));
  }
  if (has_extension_ranges_) {
    printer->Print(
        "if (!Equals(_extensions, other._extensions)) {\n"
        "  return false;\n"
        "}\n");
  }
  printer->Outdent();
  printer->Print(
      "  return Equals(_unknownFields, other._unknownFields);\n"
      "}\n\n");

  // GetHashCode
  // Start with a non-zero value to easily distinguish between null and "empty"
  // messages.
  WriteGeneratedCodeAttributes(printer);
  printer->Print(
      "public override int GetHashCode() {\n"
      "  int hash = 1;\n");
  printer->Indent();
  for (int i = 0; i < descriptor_->field_count(); i++) {
    std::unique_ptr<FieldGeneratorBase> generator(
        CreateFieldGeneratorInternal(descriptor_->field(i)));
    generator->WriteHash(printer);
  }
  for (int i = 0; i < descriptor_->real_oneof_decl_count(); i++) {
    printer->Print(
        "hash ^= (int) $name$Case_;\n", "name",
        UnderscoresToCamelCase(descriptor_->oneof_decl(i)->name(), false));
  }
  if (has_extension_ranges_) {
    printer->Print(
        "if (_extensions != null) {\n"
        "  hash ^= _extensions.GetHashCode();\n"
        "}\n");
  }
  printer->Print(
      "if (_unknownFields != null) {\n"
      "  hash ^= _unknownFields.GetHashCode();\n"
      "}\n"
      "return hash;\n");
  printer->Outdent();
  printer->Print("}\n\n");

  WriteGeneratedCodeAttributes(printer);
  printer->Print(
      "public override string ToString() {\n"
      "  return pb::JsonFormatter.ToDiagnosticString(this);\n"
      "}\n\n");
}